

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::EndGroup(void)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  ImVec2 rhs;
  bool bVar3;
  bool bVar4;
  float fVar5;
  bool group_contains_prev_active_id;
  ImVec2 IStack_48;
  bool group_contains_curr_active_id;
  ImVec2 local_40;
  ImVec2 local_38;
  undefined1 local_30 [8];
  ImRect group_bb;
  ImGuiGroupData *group_data;
  ImGuiWindow *window;
  ImGuiContext *g;
  
  pIVar2 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  if ((pIVar1->DC).GroupStack.Size < 1) {
    __assert_fail("window->DC.GroupStack.Size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x1fa2,"void ImGui::EndGroup()");
  }
  rhs = (ImVec2)ImVector<ImGuiGroupData>::back(&(pIVar1->DC).GroupStack);
  group_bb.Max = rhs;
  local_38 = ImMax(&(pIVar1->DC).CursorMaxPos,(ImVec2 *)rhs);
  ImRect::ImRect((ImRect *)local_30,(ImVec2 *)rhs,&local_38);
  (pIVar1->DC).CursorPos = *(ImVec2 *)group_bb.Max;
  local_40 = ImMax((ImVec2 *)((long)group_bb.Max + 8),&(pIVar1->DC).CursorMaxPos);
  (pIVar1->DC).CursorMaxPos = local_40;
  (pIVar1->DC).Indent.x = *(float *)((long)group_bb.Max + 0x10);
  (pIVar1->DC).GroupOffset.x = *(float *)((long)group_bb.Max + 0x14);
  (pIVar1->DC).CurrLineSize = *(ImVec2 *)((long)group_bb.Max + 0x18);
  (pIVar1->DC).CurrLineTextBaseOffset = *(float *)((long)group_bb.Max + 0x20);
  if ((pIVar2->LogEnabled & 1U) != 0) {
    pIVar2->LogLinePosY = -3.4028235e+38;
  }
  if ((*(byte *)((long)group_bb.Max + 0x29) & 1) == 0) {
    ImVector<ImGuiGroupData>::pop_back(&(pIVar1->DC).GroupStack);
  }
  else {
    fVar5 = ImMax<float>((pIVar1->DC).PrevLineTextBaseOffset,*(float *)((long)group_bb.Max + 0x20));
    (pIVar1->DC).CurrLineTextBaseOffset = fVar5;
    IStack_48 = ImRect::GetSize((ImRect *)local_30);
    ItemSize(&stack0xffffffffffffffb8,-1.0);
    ItemAdd((ImRect *)local_30,0,(ImRect *)0x0);
    bVar3 = false;
    if ((*(ImGuiID *)((long)group_bb.Max + 0x24) != pIVar2->ActiveId) &&
       (bVar3 = false, pIVar2->ActiveIdIsAlive == pIVar2->ActiveId)) {
      bVar3 = pIVar2->ActiveId != 0;
    }
    bVar4 = false;
    if ((*(byte *)((long)group_bb.Max + 0x28) & 1) == 0) {
      bVar4 = (pIVar2->ActiveIdPreviousFrameIsAlive & 1U) == 1;
    }
    if (bVar3) {
      (pIVar1->DC).LastItemId = pIVar2->ActiveId;
    }
    else if (bVar4) {
      (pIVar1->DC).LastItemId = pIVar2->ActiveIdPreviousFrame;
    }
    (pIVar1->DC).LastItemRect.Min.x = (float)local_30._0_4_;
    (pIVar1->DC).LastItemRect.Min.y = (float)local_30._4_4_;
    (pIVar1->DC).LastItemRect.Max = group_bb.Min;
    if ((bVar3) && ((pIVar2->ActiveIdHasBeenEditedThisFrame & 1U) != 0)) {
      (pIVar1->DC).LastItemStatusFlags = (pIVar1->DC).LastItemStatusFlags | 4;
    }
    (pIVar1->DC).LastItemStatusFlags = (pIVar1->DC).LastItemStatusFlags | 0x20;
    if ((bVar4) && (pIVar2->ActiveId != pIVar2->ActiveIdPreviousFrame)) {
      (pIVar1->DC).LastItemStatusFlags = (pIVar1->DC).LastItemStatusFlags | 0x40;
    }
    ImVector<ImGuiGroupData>::pop_back(&(pIVar1->DC).GroupStack);
  }
  return;
}

Assistant:

void ImGui::EndGroup()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IM_ASSERT(window->DC.GroupStack.Size > 0); // Mismatched BeginGroup()/EndGroup() calls

    ImGuiGroupData& group_data = window->DC.GroupStack.back();

    ImRect group_bb(group_data.BackupCursorPos, ImMax(window->DC.CursorMaxPos, group_data.BackupCursorPos));

    window->DC.CursorPos = group_data.BackupCursorPos;
    window->DC.CursorMaxPos = ImMax(group_data.BackupCursorMaxPos, window->DC.CursorMaxPos);
    window->DC.Indent = group_data.BackupIndent;
    window->DC.GroupOffset = group_data.BackupGroupOffset;
    window->DC.CurrLineSize = group_data.BackupCurrLineSize;
    window->DC.CurrLineTextBaseOffset = group_data.BackupCurrLineTextBaseOffset;
    if (g.LogEnabled)
        g.LogLinePosY = -FLT_MAX; // To enforce Log carriage return

    if (!group_data.EmitItem)
    {
        window->DC.GroupStack.pop_back();
        return;
    }

    window->DC.CurrLineTextBaseOffset = ImMax(window->DC.PrevLineTextBaseOffset, group_data.BackupCurrLineTextBaseOffset);      // FIXME: Incorrect, we should grab the base offset from the *first line* of the group but it is hard to obtain now.
    ItemSize(group_bb.GetSize());
    ItemAdd(group_bb, 0);

    // If the current ActiveId was declared within the boundary of our group, we copy it to LastItemId so IsItemActive(), IsItemDeactivated() etc. will be functional on the entire group.
    // It would be be neater if we replaced window.DC.LastItemId by e.g. 'bool LastItemIsActive', but would put a little more burden on individual widgets.
    // Also if you grep for LastItemId you'll notice it is only used in that context.
    // (The two tests not the same because ActiveIdIsAlive is an ID itself, in order to be able to handle ActiveId being overwritten during the frame.)
    const bool group_contains_curr_active_id = (group_data.BackupActiveIdIsAlive != g.ActiveId) && (g.ActiveIdIsAlive == g.ActiveId) && g.ActiveId;
    const bool group_contains_prev_active_id = (group_data.BackupActiveIdPreviousFrameIsAlive == false) && (g.ActiveIdPreviousFrameIsAlive == true);
    if (group_contains_curr_active_id)
        window->DC.LastItemId = g.ActiveId;
    else if (group_contains_prev_active_id)
        window->DC.LastItemId = g.ActiveIdPreviousFrame;
    window->DC.LastItemRect = group_bb;

    // Forward Edited flag
    if (group_contains_curr_active_id && g.ActiveIdHasBeenEditedThisFrame)
        window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_Edited;

    // Forward Deactivated flag
    window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_HasDeactivated;
    if (group_contains_prev_active_id && g.ActiveId != g.ActiveIdPreviousFrame)
        window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_Deactivated;

    window->DC.GroupStack.pop_back();
    //window->DrawList->AddRect(group_bb.Min, group_bb.Max, IM_COL32(255,0,255,255));   // [Debug]
}